

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_list_infix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *cclass;
  char *cclass_00;
  char *cclass_01;
  int yythunkpos736;
  int iVar5;
  code *action;
  char *name;
  int iVar6;
  int yypos736;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_comma_operator_expr(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_1_list_infix_expr,G->begin,G->end,"yy_1_list_infix_expr");
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      do {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar5;
      iVar3 = yymatchChar(G,0x5a);
      if (iVar3 == 0) {
LAB_00118ce4:
        G->pos = iVar1;
        G->thunkpos = iVar2;
        do {
          iVar3 = G->pos;
          iVar5 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar5;
        iVar3 = yymatchString(G,"minmax");
        if (iVar3 != 0) {
          iVar3 = G->pos;
          iVar5 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",cclass_00);
          iVar6 = 7;
          if (iVar4 == 0) {
            G->pos = iVar3;
            G->thunkpos = iVar5;
            iVar6 = 0;
          }
          if (iVar6 != 7) {
            if (iVar6 != 0) goto LAB_00118f09;
            do {
              iVar3 = G->pos;
              iVar5 = G->thunkpos;
              iVar4 = yy_ws(G);
            } while (iVar4 != 0);
            G->pos = iVar3;
            G->thunkpos = iVar5;
            iVar3 = yy_comma_operator_expr(G);
            if (iVar3 != 0) {
              yyDo(G,yySet,-1,0,"yySet");
              iVar3 = G->begin;
              iVar5 = G->end;
              action = yy_3_list_infix_expr;
              name = "yy_3_list_infix_expr";
              goto LAB_00118efe;
            }
          }
        }
        G->pos = iVar1;
        G->thunkpos = iVar2;
        do {
          iVar3 = G->pos;
          iVar5 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar5;
        iVar3 = yymatchString(G,"...");
        if (iVar3 == 0) {
LAB_00118e8e:
          iVar6 = 9;
        }
        else {
          iVar3 = G->pos;
          iVar5 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",cclass_01);
          iVar6 = 9;
          if (iVar4 == 0) {
            G->pos = iVar3;
            G->thunkpos = iVar5;
            do {
              iVar3 = G->pos;
              iVar5 = G->thunkpos;
              iVar4 = yy_ws(G);
            } while (iVar4 != 0);
            G->pos = iVar3;
            G->thunkpos = iVar5;
            iVar3 = yy_comma_operator_expr(G);
            if (iVar3 == 0) goto LAB_00118e8e;
            iVar6 = 0;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_4_list_infix_expr,G->begin,G->end,"yy_4_list_infix_expr");
          }
        }
      }
      else {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"",cclass);
        if (iVar4 != 0) goto LAB_00118ce4;
        G->pos = iVar3;
        G->thunkpos = iVar5;
        do {
          iVar3 = G->pos;
          iVar5 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar5;
        iVar3 = yy_comma_operator_expr(G);
        if (iVar3 == 0) goto LAB_00118ce4;
        yyDo(G,yySet,-1,0,"yySet");
        iVar3 = G->begin;
        iVar5 = G->end;
        action = yy_2_list_infix_expr;
        name = "yy_2_list_infix_expr";
LAB_00118efe:
        yyDo(G,action,iVar3,iVar5,name);
        iVar6 = 6;
      }
LAB_00118f09:
      if (iVar6 == 0) {
LAB_00118f1a:
        iVar6 = 3;
      }
      else if (iVar6 == 9) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar6 = 0;
      }
      else if (iVar6 == 6) goto LAB_00118f1a;
    } while (iVar6 != 0);
    yyDo(G,yyPop,2,0,"yyPop");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

YY_RULE(int) yy_list_infix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_infix_expr"));
  if (!yy_comma_operator_expr(G))  goto l733;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_1_list_infix_expr, G->begin, G->end, "yy_1_list_infix_expr");

  l734:;	
  {  int yypos735= G->pos, yythunkpos735= G->thunkpos;
  {  int yypos736= G->pos, yythunkpos736= G->thunkpos;  if (!yy__(G))  goto l737;
  if (!yymatchChar(G, 'Z')) goto l737;

  {  int yypos738= G->pos, yythunkpos738= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_a-zA-Z0-9")) goto l738;
  goto l737;
  l738:;	  G->pos= yypos738; G->thunkpos= yythunkpos738;
  }  if (!yy__(G))  goto l737;
  if (!yy_comma_operator_expr(G))  goto l737;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_list_infix_expr, G->begin, G->end, "yy_2_list_infix_expr");
  goto l736;
  l737:;	  G->pos= yypos736; G->thunkpos= yythunkpos736;  if (!yy__(G))  goto l739;
  if (!yymatchString(G, "minmax")) goto l739;

  {  int yypos740= G->pos, yythunkpos740= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_a-zA-Z0-9")) goto l740;
  goto l739;
  l740:;	  G->pos= yypos740; G->thunkpos= yythunkpos740;
  }  if (!yy__(G))  goto l739;
  if (!yy_comma_operator_expr(G))  goto l739;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_infix_expr, G->begin, G->end, "yy_3_list_infix_expr");
  goto l736;
  l739:;	  G->pos= yypos736; G->thunkpos= yythunkpos736;  if (!yy__(G))  goto l735;
  if (!yymatchString(G, "...")) goto l735;

  {  int yypos741= G->pos, yythunkpos741= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\140\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-._a-zA-Z0-9")) goto l741;
  goto l735;
  l741:;	  G->pos= yypos741; G->thunkpos= yythunkpos741;
  }  if (!yy__(G))  goto l735;
  if (!yy_comma_operator_expr(G))  goto l735;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_infix_expr, G->begin, G->end, "yy_4_list_infix_expr");

  }
  l736:;	  goto l734;
  l735:;	  G->pos= yypos735; G->thunkpos= yythunkpos735;
  }  yyprintf((stderr, "  ok   list_infix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l733:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_infix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}